

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O2

void intobuckets(group_conflict g,bucket_conflict *b,int *used1,int *used2,int pos)

{
  byte bVar1;
  string puVar2;
  list_conflict plVar3;
  group_conflict pgVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  group_conflict pgVar10;
  uint uVar11;
  long lVar12;
  list_conflict head;
  list_conflict tail;
  
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    used1[lVar6] = 0;
    *(undefined4 *)((long)b + lVar6 * 4) = 0;
  }
  resetmem(bucketmem);
  lVar6 = (long)(int)used2;
  pgVar4 = g;
LAB_001d69cd:
  while( true ) {
    pgVar10 = pgVar4;
    g = g->nextunf;
    if (g == (group_conflict)0x0) {
      iVar7 = 0;
      iVar8 = 0;
      for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
        if (*(int *)((long)b + lVar6 * 4) != 0) {
          lVar12 = (long)iVar7;
          iVar7 = iVar7 + 1;
          *(int *)((long)b + lVar12 * 4) = (int)lVar6;
        }
        if (used1[lVar6] != 0) {
          lVar12 = (long)iVar8;
          iVar8 = iVar8 + 1;
          used1[lVar12] = (int)lVar6;
        }
      }
      *(int *)(b + 0x80) = iVar7;
      used1[0x100] = iVar8;
      return;
    }
    if (g->finis == 0) break;
    pgVar10->nextunf = g->nextunf;
    pgVar4 = pgVar10;
  }
  puVar2 = g->head->str;
  bVar1 = puVar2[lVar6];
  if (bVar1 == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (uint)puVar2[lVar6 + 1];
  }
  bVar5 = true;
  head = g->head;
  uVar11 = (uint)bVar1 << 8 | uVar11;
  do {
    plVar3 = head;
    iVar7 = 1;
    do {
      iVar8 = iVar7;
      tail = plVar3;
      plVar3 = tail->next;
      if (plVar3 == (list_conflict)0x0) {
        pgVar4 = g;
        if (bVar5) {
          if ((char)uVar11 == '\0') {
            pgVar10->nextunf = g->nextunf;
            pgVar4 = pgVar10;
          }
        }
        else {
          intobucket((bucket_conflict *)(forward2_b + (ulong)uVar11 * 8),head,tail,iVar8,g);
          g->head = (list_conflict)0x0;
          used1[uVar11 & 0xff] = 1;
          *(undefined4 *)((long)b + (ulong)(uVar11 >> 8) * 4) = 1;
        }
        goto LAB_001d69cd;
      }
      bVar1 = plVar3->str[lVar6];
      if (bVar1 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (uint)plVar3->str[lVar6 + 1];
      }
      uVar9 = (uint)bVar1 << 8 | uVar9;
      iVar7 = iVar8 + 1;
    } while (uVar9 == uVar11);
    intobucket((bucket_conflict *)(forward2_b + (ulong)uVar11 * 8),head,tail,iVar8,g);
    g->head = plVar3;
    used1[uVar11 & 0xff] = 1;
    *(undefined4 *)((long)b + (ulong)(uVar11 >> 8) * 4) = 1;
    bVar5 = false;
    head = plVar3;
    uVar11 = uVar9;
  } while( true );
}

Assistant:

static void intobuckets(group g, bucket b[], 
                        int *used1, int *used2, int pos)
{
   group prevg;
   character ch, prevch;
   boolean split;
   list tail, tailn;
   int size;
   character buckets1, buckets2;

   for (ch = 0; ch < CHARS; ch++)
      used1[ch] = used2[ch] = FALSE;
   resetmem(bucketmem);
   for (prevg = g, g = g->nextunf ; g; g = g->nextunf) {
      if (g->finis)
         {prevg->nextunf = g->nextunf; continue;}
      tail = g->head; split = FALSE;
      prevch = SHORT(tail->str, pos); size = 1;
      for ( ; (tailn = tail->next); tail = tailn) {
         ch = SHORT(tailn->str, pos); size++;
         if (ch == prevch) continue;
         intobucket(b+prevch, g->head, tail, size-1, g);
         g->head = tailn; split = TRUE;
         used1[HIGH(prevch)] = used2[LOW(prevch)] = TRUE;
         prevch = ch; size = 1;
      }
      if (split) {
         intobucket(b+prevch, g->head, tail, size, g);
         g->head = NULL;
         used1[HIGH(prevch)] = used2[LOW(prevch)] = TRUE;
         prevg = g;
      } else if (IS_ENDMARK(prevch))
         prevg->nextunf = g->nextunf;
      else
         prevg = g;
   }
   buckets1 = buckets2 = 0;
   for (ch = 0; ch < CHARS; ch++) {
      if (used1[ch]) used1[buckets1++] = ch;
      if (used2[ch]) used2[buckets2++] = ch;
   }
   used1[CHARS] = buckets1; used2[CHARS] = buckets2;
/* printf("#buckets: %i\n", bucketp-bucketbase); */
}